

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O0

void __thiscall slang::ast::Symbol::appendHierarchicalPath(Symbol *this,string *result)

{
  string_view str;
  undefined1 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_t __n;
  char *in_RSI;
  char *in_RDI;
  FormatBuffer buffer;
  FormatBuffer *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  FormatBuffer *in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd98;
  FormatBuffer *in_stack_ffffffffffffffb8;
  Symbol *in_stack_ffffffffffffffc0;
  
  FormatBuffer::FormatBuffer(in_stack_fffffffffffffd80);
  getHierarchicalPathImpl(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  uVar1 = FormatBuffer::empty((FormatBuffer *)0x4bbc5e);
  if ((bool)uVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd90,
               in_stack_fffffffffffffd88);
    str._M_len._7_1_ = uVar1;
    str._M_len._0_7_ = in_stack_fffffffffffffd98;
    str._M_str = in_RDI;
    FormatBuffer::append(in_stack_fffffffffffffd90,str);
  }
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            FormatBuffer::data((FormatBuffer *)0x4bbcc8);
  __n = FormatBuffer::size((FormatBuffer *)0x4bbcd9);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (this_00,in_RSI,__n);
  FormatBuffer::~FormatBuffer((FormatBuffer *)0x4bbd00);
  return;
}

Assistant:

void Symbol::appendHierarchicalPath(std::string& result) const {
    FormatBuffer buffer;
    getHierarchicalPathImpl(*this, buffer);
    if (buffer.empty())
        buffer.append("$unit");

    result.append(buffer.data(), buffer.size());
}